

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptError.cpp
# Opt level: O2

ErrorTypeEnum Js::JavascriptError::MapParseError(int32 hCode)

{
  ErrorTypeEnum EVar1;
  ErrorTypeEnum EVar2;
  
  EVar1 = kjstError;
  EVar2 = EVar1;
  switch(hCode) {
  case -0x7ff5ec78:
  case -0x7ff5ec6d:
  case -0x7ff5ec62:
  case -0x7ff5ec56:
  case -0x7ff5ec55:
  case -0x7ff5ec50:
  case -0x7ff5ec12:
  case -0x7ff5ec11:
  case -0x7ff5ec08:
  case -0x7ff5ebe4:
  case -0x7ff5ebb0:
  case -0x7ff5ebaf:
  case -0x7ff5ebae:
    break;
  case -0x7ff5ec77:
  case -0x7ff5ec76:
  case -0x7ff5ec74:
  case -0x7ff5ec73:
  case -0x7ff5ec72:
  case -0x7ff5ec71:
  case -0x7ff5ec6f:
  case -0x7ff5ec6e:
  case -0x7ff5ec6c:
  case -0x7ff5ec6b:
  case -0x7ff5ec6a:
  case -0x7ff5ec69:
  case -0x7ff5ec68:
  case -0x7ff5ec61:
  case -0x7ff5ec5c:
  case -0x7ff5ec59:
  case -0x7ff5ec54:
  case -0x7ff5ec53:
  case -0x7ff5ec51:
  case -0x7ff5ec4f:
  case -0x7ff5ec4d:
  case -0x7ff5ec4b:
  case -0x7ff5ec4a:
  case -0x7ff5ec49:
  case -0x7ff5ec48:
  case -0x7ff5ec47:
  case -0x7ff5ec45:
  case -0x7ff5ec44:
  case -0x7ff5ec43:
  case -0x7ff5ec42:
  case -0x7ff5ec41:
  case -0x7ff5ec40:
  case -0x7ff5ec3f:
  case -0x7ff5ec3e:
  case -0x7ff5ec3d:
  case -0x7ff5ec3c:
  case -0x7ff5ec3b:
  case -0x7ff5ec3a:
  case -0x7ff5ec39:
  case -0x7ff5ec38:
  case -0x7ff5ec37:
  case -0x7ff5ec36:
  case -0x7ff5ec35:
  case -0x7ff5ec34:
  case -0x7ff5ec33:
  case -0x7ff5ec32:
  case -0x7ff5ec31:
  case -0x7ff5ec30:
  case -0x7ff5ec2f:
  case -0x7ff5ec2e:
  case -0x7ff5ec2d:
  case -0x7ff5ec2c:
  case -0x7ff5ec2b:
  case -0x7ff5ec2a:
  case -0x7ff5ec29:
  case -0x7ff5ec28:
  case -0x7ff5ec27:
  case -0x7ff5ec26:
  case -0x7ff5ec25:
  case -0x7ff5ec22:
  case -0x7ff5ec21:
  case -0x7ff5ec20:
  case -0x7ff5ec1f:
  case -0x7ff5ec1d:
  case -0x7ff5ec1c:
  case -0x7ff5ec1b:
  case -0x7ff5ec1a:
  case -0x7ff5ec18:
  case -0x7ff5ec17:
  case -0x7ff5ec16:
  case -0x7ff5ec15:
  case -0x7ff5ec14:
  case -0x7ff5ec13:
  case -0x7ff5ec10:
  case -0x7ff5ec0f:
  case -0x7ff5ec0a:
  case -0x7ff5ec09:
  case -0x7ff5ec06:
  case -0x7ff5ec05:
  case -0x7ff5ec04:
  case -0x7ff5ec03:
  case -0x7ff5ec01:
  case -0x7ff5ec00:
  case -0x7ff5ebfd:
  case -0x7ff5ebfb:
  case -0x7ff5ebfa:
  case -0x7ff5ebf5:
  case -0x7ff5ebf4:
  case -0x7ff5ebf3:
  case -0x7ff5ebf2:
  case -0x7ff5ebf1:
  case -0x7ff5ebec:
  case -0x7ff5ebeb:
  case -0x7ff5ebe5:
  case -0x7ff5ebe3:
    goto switchD_00a82305_caseD_800a15e4;
  case -0x7ff5ec75:
  case -0x7ff5ec70:
  case -0x7ff5ec4e:
  case -0x7ff5ec0c:
  case -0x7ff5ec0b:
  case -0x7ff5ec07:
  case -0x7ff5ebe7:
  case -0x7ff5ebe6:
switchD_00a82305_caseD_800a15fc:
    EVar2 = kjstReferenceError;
    break;
  case -0x7ff5ec67:
  case -0x7ff5ec66:
  case -0x7ff5ec65:
  case -0x7ff5ec64:
  case -0x7ff5ec63:
  case -0x7ff5ec58:
  case -0x7ff5ec57:
  case -0x7ff5ec4c:
  case -0x7ff5ec46:
  case -0x7ff5ec19:
  case -0x7ff5ebf9:
  case -0x7ff5ebf8:
  case -0x7ff5ebf7:
  case -0x7ff5ebf0:
  case -0x7ff5ebef:
  case -0x7ff5ebee:
  case -0x7ff5ebed:
  case -0x7ff5ebea:
  case -0x7ff5ebe9:
  case -0x7ff5ebe8:
  case -0x7ff5ebe2:
  case -0x7ff5ebe1:
  case -0x7ff5ebe0:
  case -0x7ff5ebdf:
  case -0x7ff5ebde:
  case -0x7ff5ebdd:
  case -0x7ff5ebdc:
  case -0x7ff5ebdb:
  case -0x7ff5ebda:
  case -0x7ff5ebd9:
  case -0x7ff5ebd8:
  case -0x7ff5ebd7:
  case -0x7ff5ebd6:
  case -0x7ff5ebd5:
  case -0x7ff5ebd4:
  case -0x7ff5ebd3:
  case -0x7ff5ebd2:
  case -0x7ff5ebd1:
  case -0x7ff5ebd0:
  case -0x7ff5ebcf:
  case -0x7ff5ebce:
  case -0x7ff5ebcd:
  case -0x7ff5ebcc:
  case -0x7ff5ebcb:
  case -0x7ff5ebca:
  case -0x7ff5ebc9:
  case -0x7ff5ebc8:
  case -0x7ff5ebc7:
  case -0x7ff5ebc6:
  case -0x7ff5ebc5:
  case -0x7ff5ebc4:
  case -0x7ff5ebc3:
  case -0x7ff5ebc2:
  case -0x7ff5ebc1:
  case -0x7ff5ebc0:
  case -0x7ff5ebbf:
  case -0x7ff5ebbe:
  case -0x7ff5ebbd:
  case -0x7ff5ebbc:
  case -0x7ff5ebbb:
  case -0x7ff5ebba:
  case -0x7ff5ebb9:
  case -0x7ff5ebb8:
  case -0x7ff5ebb7:
  case -0x7ff5ebb6:
  case -0x7ff5ebb5:
  case -0x7ff5ebb4:
  case -0x7ff5ebb3:
  case -0x7ff5ebb2:
  case -0x7ff5ebb1:
switchD_00a82305_caseD_800a15e7:
    EVar2 = kjstSyntaxError;
    break;
  case -0x7ff5ec60:
  case -0x7ff5ec5f:
    EVar2 = kjstURIError;
    break;
  case -0x7ff5ec5e:
  case -0x7ff5ec5d:
  case -0x7ff5ec5b:
  case -0x7ff5ec5a:
  case -0x7ff5ec52:
  case -0x7ff5ec24:
  case -0x7ff5ec23:
  case -0x7ff5ec1e:
  case -0x7ff5ec0e:
  case -0x7ff5ec0d:
  case -0x7ff5ec02:
  case -0x7ff5ebff:
  case -0x7ff5ebfe:
  case -0x7ff5ebfc:
  case -0x7ff5ebf6:
switchD_00a82305_caseD_800a15e0:
    EVar2 = kjstRangeError;
    break;
  default:
    EVar2 = kjstError;
    switch(hCode) {
    case -0x7ff5ea20:
    case -0x7ff5ea1f:
    case -0x7ff5ea1e:
    case -0x7ff5ea1d:
    case -0x7ff5e9f3:
    case -0x7ff5e9e1:
    case -0x7ff5e9e0:
    case -0x7ff5e9df:
    case -0x7ff5e9da:
    case -0x7ff5e9d5:
      goto switchD_00a82305_caseD_800a15e0;
    case -0x7ff5ea1c:
    case -0x7ff5ea1b:
    case -0x7ff5ea1a:
    case -0x7ff5ea18:
    case -0x7ff5ea17:
    case -0x7ff5ea16:
    case -0x7ff5ea15:
    case -0x7ff5ea14:
    case -0x7ff5ea13:
    case -0x7ff5ea12:
    case -0x7ff5ea11:
    case -0x7ff5ea10:
    case -0x7ff5ea0f:
    case -0x7ff5ea0e:
    case -0x7ff5ea0d:
    case -0x7ff5ea0c:
    case -0x7ff5ea0b:
    case -0x7ff5ea05:
    case -0x7ff5ea02:
    case -0x7ff5ea01:
    case -0x7ff5ea00:
    case -0x7ff5e9ff:
    case -0x7ff5e9fe:
    case -0x7ff5e9fd:
    case -0x7ff5e9fc:
    case -0x7ff5e9fb:
    case -0x7ff5e9fa:
    case -0x7ff5e9f9:
    case -0x7ff5e9f8:
    case -0x7ff5e9f7:
    case -0x7ff5e9f6:
    case -0x7ff5e9f0:
    case -0x7ff5e9ef:
    case -0x7ff5e9ee:
    case -0x7ff5e9ed:
    case -0x7ff5e9ec:
    case -0x7ff5e9eb:
    case -0x7ff5e9ea:
    case -0x7ff5e9e9:
    case -0x7ff5e9e8:
    case -0x7ff5e9e7:
    case -0x7ff5e9e6:
    case -0x7ff5e9e5:
    case -0x7ff5e9e4:
    case -0x7ff5e9e3:
    case -0x7ff5e9e2:
    case -0x7ff5e9de:
    case -0x7ff5e9dd:
    case -0x7ff5e9dc:
    case -0x7ff5e9d9:
    case -0x7ff5e9d8:
    case -0x7ff5e9d7:
    case -0x7ff5e9d4:
    case -0x7ff5e9d2:
    case -0x7ff5e9d1:
    case -0x7ff5e9d0:
    case -0x7ff5e9bc:
      goto switchD_00a82305_caseD_800a15e4;
    case -0x7ff5ea19:
    case -0x7ff5ea09:
    case -0x7ff5ea08:
    case -0x7ff5ea07:
    case -0x7ff5ea06:
    case -0x7ff5e9f5:
    case -0x7ff5e9f4:
    case -0x7ff5e9f1:
    case -0x7ff5e9d6:
    case -0x7ff5e9d3:
    case -0x7ff5e9cf:
    case -0x7ff5e9ce:
    case -0x7ff5e9cd:
    case -0x7ff5e9cc:
    case -0x7ff5e9cb:
    case -0x7ff5e9ca:
    case -0x7ff5e9c9:
    case -0x7ff5e9c8:
    case -0x7ff5e9c7:
    case -0x7ff5e9c6:
    case -0x7ff5e9c5:
    case -0x7ff5e9c4:
    case -0x7ff5e9c3:
    case -0x7ff5e9c2:
    case -0x7ff5e9c1:
    case -0x7ff5e9c0:
    case -0x7ff5e9bf:
    case -0x7ff5e9be:
    case -0x7ff5e9bd:
      goto switchD_00a82305_caseD_800a15e7;
    case -0x7ff5ea0a:
      EVar2 = kjstAggregateError;
      break;
    case -0x7ff5ea04:
    case -0x7ff5ea03:
    case -0x7ff5e9f2:
      goto switchD_00a82305_caseD_800a15fc;
    case -0x7ff5e9db:
      break;
    default:
      switch(hCode) {
      case -0x7ff5e4a8:
        EVar2 = kjstWebAssemblyCompileError;
        break;
      case -0x7ff5e4a7:
      case -0x7ff5e49e:
      case -0x7ff5e49a:
      case -0x7ff5e498:
      case -0x7ff5e497:
      case -0x7ff5e491:
      case -0x7ff5e48f:
      case -0x7ff5e489:
        EVar2 = kjstWebAssemblyRuntimeError;
        break;
      case -0x7ff5e4a4:
      case -0x7ff5e4a0:
      case -0x7ff5e49c:
      case -0x7ff5e499:
      case -0x7ff5e495:
      case -0x7ff5e48c:
      case -0x7ff5e48b:
      case -0x7ff5e48a:
        EVar2 = kjstWebAssemblyLinkError;
        break;
      case -0x7ff5e4a2:
        goto switchD_00a82305_caseD_800a15e7;
      default:
        EVar2 = EVar1;
        switch(hCode) {
        case -0x7ff5fe53:
        case -0x7ff5fe52:
        case -0x7ff5fe50:
        case -0x7ff5fe42:
        case -0x7ff5fe41:
        case -0x7ff5fe40:
        case -0x7ff5fe3b:
        case -0x7ff5fe32:
          goto switchD_00a82305_caseD_800a1625;
        case -0x7ff5fe51:
        case -0x7ff5fe4f:
        case -0x7ff5fe4e:
        case -0x7ff5fe4d:
        case -0x7ff5fe4c:
        case -0x7ff5fe4b:
        case -0x7ff5fe49:
        case -0x7ff5fe48:
        case -0x7ff5fe47:
        case -0x7ff5fe46:
        case -0x7ff5fe45:
        case -0x7ff5fe44:
        case -0x7ff5fe3c:
        case -0x7ff5fe3a:
        case -0x7ff5fe39:
        case -0x7ff5fe38:
        case -0x7ff5fe37:
        case -0x7ff5fe35:
        case -0x7ff5fe34:
        case -0x7ff5fe33:
          goto switchD_00a82305_caseD_800a15e7;
        case -0x7ff5fe4a:
        case -0x7ff5fe43:
        case -0x7ff5fe3f:
        case -0x7ff5fe3e:
        case -0x7ff5fe3d:
        case -0x7ff5fe36:
          break;
        default:
          if ((hCode + 0x7ff5ffe4U < 0x31) &&
             ((0x1848262900001U >> ((ulong)(hCode + 0x7ff5ffe4U) & 0x3f) & 1) != 0)) {
            return kjstError;
          }
          switch(hCode) {
          case -0x7ff60000:
          case -0x7ff5fff9:
          case -0x7ff5fff6:
            goto switchD_00a82305_caseD_800a1625;
          case -0x7ff5ffff:
          case -0x7ff5fffe:
          case -0x7ff5fffd:
          case -0x7ff5fffc:
          case -0x7ff5fff8:
          case -0x7ff5fff5:
          case -0x7ff5fff4:
            goto switchD_00a82305_caseD_800a15e7;
          case -0x7ff5fffb:
          case -0x7ff5fff3:
            break;
          case -0x7ff5fffa:
          case -0x7ff5fff7:
            goto switchD_00a82305_caseD_800a15e0;
          default:
            if (hCode == -0x7ff5febe) {
              return kjstError;
            }
            if (hCode == -0x7ff5fe05) {
              return kjstError;
            }
            if (((hCode != -0x7ff5e958) && (hCode != -0x7ff5e3e0)) && (hCode != -0x7ff5e37c)) {
              if (hCode == -0x7ff57fd4) goto switchD_00a82305_caseD_800a15e0;
              if (hCode == -0x76fdffff) {
                return kjstError;
              }
              goto switchD_00a82305_caseD_800a15e7;
            }
          }
        }
      case -0x7ff5e4a6:
      case -0x7ff5e4a5:
      case -0x7ff5e4a3:
      case -0x7ff5e4a1:
      case -0x7ff5e49f:
      case -0x7ff5e49d:
      case -0x7ff5e49b:
      case -0x7ff5e496:
      case -0x7ff5e494:
      case -0x7ff5e493:
      case -0x7ff5e492:
      case -0x7ff5e490:
      case -0x7ff5e48e:
      case -0x7ff5e48d:
      case -0x7ff5e488:
switchD_00a82305_caseD_800a15e4:
        EVar2 = kjstTypeError;
      }
    }
  }
switchD_00a82305_caseD_800a1625:
  return EVar2;
}

Assistant:

ErrorTypeEnum JavascriptError::MapParseError(int32 hCode)
    {
        switch (hCode)
        {
#define RT_ERROR_MSG(name, errnum, str1, str2, jst, errorNumSource) \
        case name: \
            return jst; \
        break;
#define RT_PUBLICERROR_MSG(name, errnum, str1, str2, jst, errorNumSource) RT_ERROR_MSG(name, errnum, str1, str2, jst, errorNumSource)
#include "rterrors.h"
#undef RT_PUBLICERROR_MSG
#undef RT_ERROR_MSG
        default:
            return kjstSyntaxError;
        }
    }